

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tflags.h
# Opt level: O1

void __thiscall ADynamicLight::Activate(ADynamicLight *this,AActor *activator)

{
  byte *pbVar1;
  double dVar2;
  
  pbVar1 = (byte *)((long)&(this->super_AActor).flags2.Value + 3);
  *pbVar1 = *pbVar1 & 0xef;
  this->m_currentRadius = (float)this->m_Radius[0];
  this->m_tickCount = 0;
  if (this->lighttype == '\x01') {
    dVar2 = (this->super_AActor).Angles.Yaw.Degrees;
    this->m_lastUpdate = level.maptime;
    FCycler::SetParams(&this->m_cycler,(float)this->m_Radius[1],(float)this->m_Radius[0],
                       (float)(dVar2 * 0.02857142857142857));
    (this->m_cycler).m_shouldCycle = true;
    (this->m_cycler).m_cycleType = CYCLE_Sin;
    this->m_currentRadius = (float)((int)(this->m_cycler).m_current & 0xff);
  }
  return;
}

Assistant:

Self& operator&= (Self other) { Value &= other.GetValue(); return *this; }